

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

Base ** GetGenericProperty<Assimp::SharedPostProcessInfo::Base*>
                  (map<unsigned_int,_Assimp::SharedPostProcessInfo::Base_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
                   *list,char *szName,Base **errorReturn)

{
  const_iterator cVar1;
  _Base_ptr *pp_Var2;
  uint32_t hash;
  
  if (szName != (char *)0x0) {
    SuperFastHash(szName,0,0);
    cVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>,_std::_Select1st<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_Assimp::SharedPostProcessInfo::Base_*>_>_>
            ::find(&list->_M_t,&hash);
    pp_Var2 = &cVar1._M_node[1]._M_parent;
    if ((_Rb_tree_header *)cVar1._M_node == &(list->_M_t)._M_impl.super__Rb_tree_header) {
      pp_Var2 = (_Base_ptr *)errorReturn;
    }
    return (Base **)pp_Var2;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/GenericProperty.h"
                ,0x50,
                "const T &GetGenericProperty(const std::map<unsigned int, T> &, const char *, const T &) [T = Assimp::SharedPostProcessInfo::Base *]"
               );
}

Assistant:

inline
const T& GetGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName, const T& errorReturn) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return errorReturn;
    }

    return (*it).second;
}